

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_P256.c
# Opt level: O2

_Bool Hacl_P256_ecdsa_sign_p256_without_hash
                (uint8_t *signature,uint32_t msg_len,uint8_t *msg,uint8_t *private_key,
                uint8_t *nonce)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  _Bool _Var4;
  uint64_t *os;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  
  uVar1 = *(ulong *)msg;
  uVar2 = *(ulong *)(msg + 8);
  uVar3 = *(ulong *)(msg + 0x18);
  local_48 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
             (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
             (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  uVar3 = *(ulong *)(msg + 0x10);
  local_40 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
             (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
             (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  local_38 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
             (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
             (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  local_30 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
             (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
             (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  qmod_short(&local_48,&local_48);
  _Var4 = ecdsa_sign_msg_as_qelem(signature,&local_48,private_key,nonce);
  return _Var4;
}

Assistant:

bool
Hacl_P256_ecdsa_sign_p256_without_hash(
  uint8_t *signature,
  uint32_t msg_len,
  uint8_t *msg,
  uint8_t *private_key,
  uint8_t *nonce
)
{
  uint64_t m_q[4U] = { 0U };
  uint8_t mHash[32U] = { 0U };
  memcpy(mHash, msg, 32U * sizeof (uint8_t));
  KRML_MAYBE_UNUSED_VAR(msg_len);
  uint8_t *mHash32 = mHash;
  bn_from_bytes_be4(m_q, mHash32);
  qmod_short(m_q, m_q);
  bool res = ecdsa_sign_msg_as_qelem(signature, m_q, private_key, nonce);
  return res;
}